

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

SerialArena * __thiscall
google::protobuf::internal::ThreadSafeArena::GetSerialArenaFallback(ThreadSafeArena *this,size_t n)

{
  ThreadSafeArena *id;
  atomic<google::protobuf::internal::SerialArena_*> *paVar1;
  __pointer_type serial;
  Nonnull<const_char_*> failure_msg;
  ThreadSafeArena *in_RCX;
  ulong uVar2;
  __pointer_type this_00;
  long *in_FS_OFFSET;
  Span<const_std::atomic<void_*>_> SVar3;
  SizedPtr SVar4;
  SizedPtr mem;
  LogMessageFatal LStack_38;
  
  id = (ThreadSafeArena *)(*in_FS_OFFSET + -0x80);
  if (id == (ThreadSafeArena *)this->first_owner_) {
    serial = &this->first_arena_;
LAB_001f750e:
    in_FS_OFFSET[-0xe] = (long)serial;
    in_FS_OFFSET[-0xf] = this->tag_and_id_;
    return serial;
  }
  this_00 = (this->head_)._M_b._M_p;
  if (((ulong)this_00 & 7) == 0) {
    serial = (__pointer_type)0x0;
    do {
      if (*(int *)(this_00 + 8) == 0) {
        if (serial == (__pointer_type)0x0) {
          SVar4 = anon_unknown_12::AllocateBlock
                            ((AllocationPolicy *)
                             ((this->alloc_policy_).policy_ & 0xfffffffffffffff8),0,n + 0x78);
          mem.n = (size_t)this;
          mem.p = (void *)SVar4.n;
          serial = SerialArena::New((SerialArena *)SVar4.p,mem,in_RCX);
          AddSerialArena(this,id,serial);
        }
        goto LAB_001f750e;
      }
      SVar3 = SerialArenaChunk::ids(this_00);
      if (SVar3.len_ != 0) {
        uVar2 = 0;
        do {
          in_RCX = (ThreadSafeArena *)SVar3.ptr_[uVar2]._M_b._M_p;
          if (id == in_RCX) {
            paVar1 = SerialArenaChunk::arena(this_00,(uint32_t)uVar2);
            serial = (paVar1->_M_b)._M_p;
            if (serial == (__pointer_type)0x0) {
              failure_msg = absl::lts_20250127::log_internal::
                            MakeCheckOpString<void_const*,void_const*>
                                      ((void *)0x0,(void *)0x0,"serial != nullptr");
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        (&LStack_38,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.cc"
                         ,0x3c5,failure_msg);
              absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_38);
            }
            break;
          }
          uVar2 = (ulong)((uint32_t)uVar2 + 1);
        } while (uVar2 < SVar3.len_);
      }
      this_00 = *(__pointer_type *)this_00;
    } while (((ulong)this_00 & 7) == 0);
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, std::integer_sequence<unsigned long, 1>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0>, std::integer_sequence<unsigned long, 0, 1>>::Pointer(Char *) const [Elements = std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, StaticSizeSeq = std::integer_sequence<unsigned long, 1>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1>, N = 0UL, Char = const char]"
               );
}

Assistant:

PROTOBUF_NOINLINE
SerialArena* ThreadSafeArena::GetSerialArenaFallback(size_t n) {
  void* const id = &thread_cache();
  if (id == first_owner_) {
    CacheSerialArena(&first_arena_);
    return &first_arena_;
  }

  // Search matching SerialArena.
  SerialArena* serial = nullptr;
  WalkConstSerialArenaChunk([&serial, id](const SerialArenaChunk* chunk) {
    absl::Span<const std::atomic<void*>> ids = chunk->ids();
    for (uint32_t i = 0; i < ids.size(); ++i) {
      if (ids[i].load(std::memory_order_relaxed) == id) {
        serial = chunk->arena(i).load(std::memory_order_relaxed);
        ABSL_DCHECK_NE(serial, nullptr);
        break;
      }
    }
  });

  if (!serial) {
    // This thread doesn't have any SerialArena, which also means it doesn't
    // have any blocks yet.  So we'll allocate its first block now. It must be
    // big enough to host SerialArena and the pending request.
    serial = SerialArena::New(
        AllocateBlock(alloc_policy_.get(), 0, n + kSerialArenaSize), *this);

    AddSerialArena(id, serial);
  }

  CacheSerialArena(serial);
  return serial;
}